

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

NAMED * lookup(XML_Parser parser,HASH_TABLE *table,KEY name,size_t createSize)

{
  char *pcVar1;
  ulong uVar2;
  bool bVar3;
  unsigned_long uVar4;
  size_t sVar5;
  NAMED **ppNVar6;
  unsigned_long uVar7;
  NAMED *pNVar8;
  byte bVar9;
  byte bVar10;
  ulong uVar11;
  char cVar12;
  byte bVar13;
  size_t sVar14;
  ulong unaff_R13;
  ulong uVar15;
  long lVar16;
  size_t __n;
  
  if (table->size == 0) {
    if (createSize == 0) {
LAB_00401b4f:
      bVar3 = false;
    }
    else {
      table->power = '\x06';
      table->size = 0x40;
      ppNVar6 = (NAMED **)(*table->mem->malloc_fcn)(0x200);
      table->v = ppNVar6;
      if (ppNVar6 == (NAMED **)0x0) {
        table->size = 0;
        goto LAB_00401b4f;
      }
      memset(ppNVar6,0,0x200);
      uVar4 = hash(parser,name);
      unaff_R13 = table->size - 1 & uVar4;
      bVar3 = true;
    }
    if (!bVar3) {
      return (NAMED *)0x0;
    }
    goto LAB_00401b71;
  }
  uVar4 = hash(parser,name);
  sVar14 = table->size;
  unaff_R13 = sVar14 - 1 & uVar4;
  pNVar8 = table->v[unaff_R13];
  if (pNVar8 != (NAMED *)0x0) {
    bVar13 = 0;
    do {
      if (*name == *pNVar8->name) {
        lVar16 = 1;
        cVar12 = *name;
        do {
          if (cVar12 == '\0') {
            bVar3 = false;
            goto LAB_00401b6d;
          }
          cVar12 = name[lVar16];
          pcVar1 = pNVar8->name + lVar16;
          lVar16 = lVar16 + 1;
        } while (cVar12 == *pcVar1);
      }
      if (bVar13 == 0) {
        bVar13 = (byte)((-sVar14 & uVar4) >> ((char)*(undefined4 *)&table->power - 1U & 0x3f)) &
                 (byte)(sVar14 - 1 >> 2) | 1;
      }
      sVar5 = 0;
      if (unaff_R13 < bVar13) {
        sVar5 = sVar14;
      }
      unaff_R13 = (unaff_R13 - bVar13) + sVar5;
      pNVar8 = table->v[unaff_R13];
    } while (pNVar8 != (NAMED *)0x0);
  }
  if (createSize == 0) {
    bVar3 = false;
LAB_00401b59:
    pNVar8 = (NAMED *)0x0;
  }
  else {
    bVar13 = (byte)*(undefined4 *)&table->power;
    if (table->used >> (bVar13 - 1 & 0x3f) == 0) {
      bVar3 = true;
      goto LAB_00401b59;
    }
    bVar10 = bVar13 + 1;
    sVar14 = 1L << (bVar10 & 0x3f);
    __n = 8L << (bVar10 & 0x3f);
    ppNVar6 = (NAMED **)(*table->mem->malloc_fcn)(__n);
    bVar3 = ppNVar6 != (NAMED **)0x0;
    if (ppNVar6 == (NAMED **)0x0) {
      pNVar8 = (NAMED *)0x0;
    }
    else {
      uVar2 = sVar14 - 1;
      memset(ppNVar6,0,__n);
      if (table->size != 0) {
        uVar15 = 0;
        do {
          if (table->v[uVar15] != (NAMED *)0x0) {
            uVar7 = hash(parser,table->v[uVar15]->name);
            uVar11 = uVar7 & uVar2;
            if (ppNVar6[uVar11] != (NAMED *)0x0) {
              bVar9 = 0;
              do {
                if (bVar9 == 0) {
                  bVar9 = (byte)((uVar7 & -sVar14) >> (bVar13 & 0x3f)) & (byte)(uVar2 >> 2) | 1;
                }
                sVar5 = 0;
                if (uVar11 < bVar9) {
                  sVar5 = sVar14;
                }
                uVar11 = (uVar11 - bVar9) + sVar5;
              } while (ppNVar6[uVar11] != (NAMED *)0x0);
            }
            ppNVar6[uVar11] = table->v[uVar15];
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 < table->size);
      }
      (*table->mem->free_fcn)(table->v);
      table->v = ppNVar6;
      table->power = bVar10;
      table->size = sVar14;
      unaff_R13 = uVar2 & uVar4;
      if (ppNVar6[unaff_R13] != (NAMED *)0x0) {
        bVar10 = 0;
        do {
          if (bVar10 == 0) {
            bVar10 = (byte)((uVar4 & -sVar14) >> (bVar13 & 0x3f)) & (byte)(uVar2 >> 2) | 1;
          }
          sVar5 = 0;
          if (unaff_R13 < bVar10) {
            sVar5 = sVar14;
          }
          unaff_R13 = (unaff_R13 - bVar10) + sVar5;
        } while (ppNVar6[unaff_R13] != (NAMED *)0x0);
      }
      pNVar8 = (NAMED *)0x0;
    }
  }
LAB_00401b6d:
  if (!bVar3) {
    return pNVar8;
  }
LAB_00401b71:
  pNVar8 = (NAMED *)(*table->mem->malloc_fcn)(createSize);
  table->v[unaff_R13] = pNVar8;
  if (table->v[unaff_R13] == (NAMED *)0x0) {
    return (NAMED *)0x0;
  }
  memset(table->v[unaff_R13],0,createSize);
  ppNVar6 = table->v;
  ppNVar6[unaff_R13]->name = name;
  table->used = table->used + 1;
  return ppNVar6[unaff_R13];
}

Assistant:

static NAMED *
lookup(XML_Parser parser, HASH_TABLE *table, KEY name, size_t createSize)
{
  size_t i;
  if (table->size == 0) {
    size_t tsize;
    if (!createSize)
      return NULL;
    table->power = INIT_POWER;
    /* table->size is a power of 2 */
    table->size = (size_t)1 << INIT_POWER;
    tsize = table->size * sizeof(NAMED *);
    table->v = (NAMED **)table->mem->malloc_fcn(tsize);
    if (!table->v) {
      table->size = 0;
      return NULL;
    }
    memset(table->v, 0, tsize);
    i = hash(parser, name) & ((unsigned long)table->size - 1);
  }
  else {
    unsigned long h = hash(parser, name);
    unsigned long mask = (unsigned long)table->size - 1;
    unsigned char step = 0;
    i = h & mask;
    while (table->v[i]) {
      if (keyeq(name, table->v[i]->name))
        return table->v[i];
      if (!step)
        step = PROBE_STEP(h, mask, table->power);
      i < step ? (i += table->size - step) : (i -= step);
    }
    if (!createSize)
      return NULL;

    /* check for overflow (table is half full) */
    if (table->used >> (table->power - 1)) {
      unsigned char newPower = table->power + 1;
      size_t newSize = (size_t)1 << newPower;
      unsigned long newMask = (unsigned long)newSize - 1;
      size_t tsize = newSize * sizeof(NAMED *);
      NAMED **newV = (NAMED **)table->mem->malloc_fcn(tsize);
      if (!newV)
        return NULL;
      memset(newV, 0, tsize);
      for (i = 0; i < table->size; i++)
        if (table->v[i]) {
          unsigned long newHash = hash(parser, table->v[i]->name);
          size_t j = newHash & newMask;
          step = 0;
          while (newV[j]) {
            if (!step)
              step = PROBE_STEP(newHash, newMask, newPower);
            j < step ? (j += newSize - step) : (j -= step);
          }
          newV[j] = table->v[i];
        }
      table->mem->free_fcn(table->v);
      table->v = newV;
      table->power = newPower;
      table->size = newSize;
      i = h & newMask;
      step = 0;
      while (table->v[i]) {
        if (!step)
          step = PROBE_STEP(h, newMask, newPower);
        i < step ? (i += newSize - step) : (i -= step);
      }
    }
  }
  table->v[i] = (NAMED *)table->mem->malloc_fcn(createSize);
  if (!table->v[i])
    return NULL;
  memset(table->v[i], 0, createSize);
  table->v[i]->name = name;
  (table->used)++;
  return table->v[i];
}